

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerNewScFunc(Lowerer *this,Instr *newScFuncInstr)

{
  bool bVar1;
  Opnd *pOVar2;
  IntConstOpnd *functionBodySlotOpnd_00;
  Instr *local_48;
  Instr *instrPrev;
  IntConstOpnd *functionBodySlotOpnd;
  RegOpnd *envOpnd;
  Instr *stackNewScFuncInstr;
  Instr *newScFuncInstr_local;
  Lowerer *this_local;
  
  envOpnd = (RegOpnd *)0x0;
  stackNewScFuncInstr = newScFuncInstr;
  newScFuncInstr_local = (Instr *)this;
  pOVar2 = IR::Instr::UnlinkSrc2(newScFuncInstr);
  functionBodySlotOpnd = (IntConstOpnd *)IR::Opnd::AsRegOpnd(pOVar2);
  bVar1 = Func::DoStackNestedFunc(stackNewScFuncInstr->m_func);
  if (bVar1) {
    envOpnd = (RegOpnd *)
              GenerateNewStackScFunc(this,stackNewScFuncInstr,(RegOpnd **)&functionBodySlotOpnd);
  }
  pOVar2 = IR::Instr::UnlinkSrc1(stackNewScFuncInstr);
  functionBodySlotOpnd_00 = IR::Opnd::AsIntConstOpnd(pOVar2);
  local_48 = LoadFunctionBodyAsArgument
                       (this,stackNewScFuncInstr,functionBodySlotOpnd_00,
                        (RegOpnd *)functionBodySlotOpnd);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,stackNewScFuncInstr,HelperScrFunc_OP_NewScFunc,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  if (envOpnd != (RegOpnd *)0x0) {
    local_48 = (Instr *)envOpnd;
  }
  return local_48;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScFunc(IR::Instr * newScFuncInstr)
{
    IR::Instr *stackNewScFuncInstr = nullptr;
    IR::RegOpnd * envOpnd = newScFuncInstr->UnlinkSrc2()->AsRegOpnd();

    if (newScFuncInstr->m_func->DoStackNestedFunc())
    {
        stackNewScFuncInstr = GenerateNewStackScFunc(newScFuncInstr, &envOpnd);
    }

    IR::IntConstOpnd * functionBodySlotOpnd = newScFuncInstr->UnlinkSrc1()->AsIntConstOpnd();

    IR::Instr * instrPrev = this->LoadFunctionBodyAsArgument(newScFuncInstr, functionBodySlotOpnd, envOpnd);
    m_lowererMD.ChangeToHelperCall(newScFuncInstr, IR::HelperScrFunc_OP_NewScFunc );

    return stackNewScFuncInstr == nullptr? instrPrev : stackNewScFuncInstr;
}